

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.hpp
# Opt level: O2

string * __thiscall
duckdb::FullLinePosition::
ReconstructCurrentLine<std::map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
          (string *__return_storage_ptr__,FullLinePosition *this,bool *first_char_nl,
          map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
          *buffer_handles,bool reconstruct_line)

{
  LinePosition *other;
  _Rb_tree_header *p_Var1;
  idx_t *__k;
  idx_t *__k_00;
  idx_t iVar2;
  bool bVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  CSVBufferHandle *pCVar6;
  data_ptr_t pdVar7;
  size_type *psVar8;
  ulong uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  undefined3 in_register_00000081;
  idx_t i;
  ulong uVar11;
  string local_50;
  
  if (CONCAT31(in_register_00000081,reconstruct_line) == 0) {
LAB_00ac2d56:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  other = &this->end;
  bVar3 = LinePosition::operator==(&this->begin,other);
  if (bVar3) goto LAB_00ac2d56;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  __k = &(this->end).buffer_idx;
  __k_00 = &(this->begin).buffer_idx;
  if ((this->end).buffer_idx == (this->begin).buffer_idx) {
    iVar4 = ::std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
            ::find(&buffer_handles->_M_t,__k);
    if ((_Rb_tree_header *)iVar4._M_node == &(buffer_handles->_M_t)._M_impl.super__Rb_tree_header) {
LAB_00ac2edb:
      paVar10 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar10;
      psVar8 = &__return_storage_ptr__->_M_string_length;
      goto LAB_00ac2f4c;
    }
    pmVar5 = ::std::
             map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
             ::operator[](buffer_handles,__k_00);
    pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar5);
    pdVar7 = BufferHandle::Ptr(&pCVar6->handle);
    iVar2 = (this->begin).buffer_pos;
    bVar3 = pdVar7[iVar2] == '\r' || pdVar7[iVar2] == '\n';
    *first_char_nl = bVar3;
    for (uVar11 = bVar3 + iVar2; uVar11 < other->buffer_pos; uVar11 = uVar11 + 1) {
      ::std::__cxx11::string::push_back((char)&local_50);
    }
  }
  else {
    iVar4 = ::std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
            ::find(&buffer_handles->_M_t,__k_00);
    p_Var1 = &(buffer_handles->_M_t)._M_impl.super__Rb_tree_header;
    if (((_Rb_tree_header *)iVar4._M_node == p_Var1) ||
       (iVar4 = ::std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
                ::find(&buffer_handles->_M_t,__k), (_Rb_tree_header *)iVar4._M_node == p_Var1))
    goto LAB_00ac2edb;
    pmVar5 = ::std::
             map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
             ::operator[](buffer_handles,__k_00);
    pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar5);
    pdVar7 = BufferHandle::Ptr(&pCVar6->handle);
    pmVar5 = ::std::
             map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
             ::operator[](buffer_handles,__k_00);
    pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar5);
    uVar11 = pCVar6->actual_size;
    pmVar5 = ::std::
             map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
             ::operator[](buffer_handles,__k);
    pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(pmVar5);
    BufferHandle::Ptr(&pCVar6->handle);
    iVar2 = (this->begin).buffer_pos;
    bVar3 = pdVar7[iVar2] == '\r' || pdVar7[iVar2] == '\n';
    *first_char_nl = bVar3;
    for (uVar9 = bVar3 + iVar2; uVar9 < uVar11; uVar9 = uVar9 + 1) {
      ::std::__cxx11::string::push_back((char)&local_50);
    }
    for (uVar11 = 0; uVar11 < other->buffer_pos; uVar11 = uVar11 + 1) {
      ::std::__cxx11::string::push_back((char)&local_50);
    }
  }
  paVar10 = &local_50.field_2;
  SanitizeError(&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar10) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_50.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0]);
  }
  psVar8 = &local_50._M_string_length;
  __return_storage_ptr__->_M_string_length = local_50._M_string_length;
  local_50._M_dataplus._M_p = (pointer)paVar10;
LAB_00ac2f4c:
  *psVar8 = 0;
  paVar10->_M_local_buf[0] = '\0';
  ::std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

string ReconstructCurrentLine(bool &first_char_nl, T &buffer_handles, bool reconstruct_line) const {
		if (!reconstruct_line || begin == end) {
			return {};
		}
		string result;
		if (end.buffer_idx == begin.buffer_idx) {
			if (buffer_handles.find(end.buffer_idx) == buffer_handles.end()) {
				return {};
			}
			auto buffer = buffer_handles[begin.buffer_idx]->Ptr();
			first_char_nl = buffer[begin.buffer_pos] == '\n' || buffer[begin.buffer_pos] == '\r';
			for (idx_t i = begin.buffer_pos + first_char_nl; i < end.buffer_pos; i++) {
				result += buffer[i];
			}
		} else {
			if (buffer_handles.find(begin.buffer_idx) == buffer_handles.end() ||
			    buffer_handles.find(end.buffer_idx) == buffer_handles.end()) {
				return {};
			}
			auto first_buffer = buffer_handles[begin.buffer_idx]->Ptr();
			auto first_buffer_size = buffer_handles[begin.buffer_idx]->actual_size;
			auto second_buffer = buffer_handles[end.buffer_idx]->Ptr();
			first_char_nl = first_buffer[begin.buffer_pos] == '\n' || first_buffer[begin.buffer_pos] == '\r';
			for (idx_t i = begin.buffer_pos + first_char_nl; i < first_buffer_size; i++) {
				result += first_buffer[i];
			}
			for (idx_t i = 0; i < end.buffer_pos; i++) {
				result += second_buffer[i];
			}
		}
		// sanitize borked line
		SanitizeError(result);
		return result;
	}